

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O3

ggml_gallocr_t ggml_gallocr_new_n(ggml_backend_buffer_type_t *bufts,int n_bufs)

{
  ggml_backend_buffer_type_t buft;
  ggml_gallocr_t pgVar1;
  ggml_backend_buffer_type_t *ppgVar2;
  ggml_backend_buffer_t *ppgVar3;
  ggml_dyn_tallocr **ppgVar4;
  ulong uVar5;
  size_t sVar6;
  ggml_dyn_tallocr *pgVar7;
  char *pcVar8;
  size_t __nmemb;
  int line;
  ulong uVar9;
  
  pgVar1 = (ggml_gallocr_t)calloc(1,0x60);
  if (pgVar1 == (ggml_gallocr_t)0x0) {
    pcVar8 = "galloc != NULL";
    line = 0x17e;
  }
  else {
    __nmemb = (size_t)n_bufs;
    ppgVar2 = (ggml_backend_buffer_type_t *)calloc(__nmemb,8);
    pgVar1->bufts = ppgVar2;
    if (ppgVar2 == (ggml_backend_buffer_type_t *)0x0) {
      pcVar8 = "galloc->bufts != NULL";
      line = 0x181;
    }
    else {
      ppgVar3 = (ggml_backend_buffer_t *)calloc(__nmemb,8);
      pgVar1->buffers = ppgVar3;
      if (ppgVar3 == (ggml_backend_buffer_t *)0x0) {
        pcVar8 = "galloc->buffers != NULL";
        line = 0x184;
      }
      else {
        ppgVar4 = (ggml_dyn_tallocr **)calloc(__nmemb,8);
        pgVar1->buf_tallocs = ppgVar4;
        if (ppgVar4 != (ggml_dyn_tallocr **)0x0) {
          if (0 < n_bufs) {
            uVar9 = 0;
            do {
              buft = bufts[uVar9];
              ppgVar2[uVar9] = buft;
              ppgVar3[uVar9] = (ggml_backend_buffer_t)0x0;
              if (uVar9 != 0) {
                uVar5 = 0;
                do {
                  if (buft == bufts[uVar5]) {
                    ppgVar4[uVar9] = ppgVar4[uVar5];
                    break;
                  }
                  uVar5 = uVar5 + 1;
                } while (uVar9 != uVar5);
              }
              if (ppgVar4[uVar9] == (ggml_dyn_tallocr *)0x0) {
                sVar6 = ggml_backend_buft_get_alignment(buft);
                pgVar7 = (ggml_dyn_tallocr *)malloc(0x1018);
                pgVar7->alignment = sVar6;
                memset(&pgVar7->n_free_blocks,0,0x1008);
                pgVar7->n_free_blocks = 1;
                pgVar7->free_blocks[0].size = 0x7fffffffffffffff;
                pgVar7->max_size = 0;
                ppgVar4[uVar9] = pgVar7;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != (uint)n_bufs);
          }
          pgVar1->n_buffers = n_bufs;
          return pgVar1;
        }
        pcVar8 = "galloc->buf_tallocs != NULL";
        line = 0x187;
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c",
             line,"GGML_ASSERT(%s) failed",pcVar8);
}

Assistant:

ggml_gallocr_t ggml_gallocr_new_n(ggml_backend_buffer_type_t * bufts, int n_bufs) {
    ggml_gallocr_t galloc = (ggml_gallocr_t)calloc(1, sizeof(struct ggml_gallocr));
    GGML_ASSERT(galloc != NULL);

    galloc->bufts = calloc(n_bufs, sizeof(ggml_backend_buffer_type_t));
    GGML_ASSERT(galloc->bufts != NULL);

    galloc->buffers = calloc(n_bufs, sizeof(ggml_backend_buffer_t));
    GGML_ASSERT(galloc->buffers != NULL);

    galloc->buf_tallocs = calloc(n_bufs, sizeof(struct ggml_dyn_tallocr *));
    GGML_ASSERT(galloc->buf_tallocs != NULL);

    for (int i = 0; i < n_bufs; i++) {
        galloc->bufts[i] = bufts[i];
        galloc->buffers[i] = NULL;

        // check if the same buffer type is used multiple times and reuse the same allocator
        for (int j = 0; j < i; j++) {
            if (bufts[i] == bufts[j]) {
                galloc->buf_tallocs[i] = galloc->buf_tallocs[j];
                break;
            }
        }

        if (galloc->buf_tallocs[i] == NULL) {
            size_t alignment = ggml_backend_buft_get_alignment(bufts[i]);
            galloc->buf_tallocs[i] = ggml_dyn_tallocr_new(alignment);
        }
    }
    galloc->n_buffers = n_bufs;

    return galloc;
}